

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool VerifyScript(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,uint flags,
                 BaseSignatureChecker *checker,ScriptError *serror)

{
  uint uVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ScriptError SVar11;
  int iVar12;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  uint uVar13;
  CScriptWitness *witness_00;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  iterator local_100;
  allocator_type local_f1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_98;
  undefined1 local_78 [32];
  CScript pubKey2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
       ::emptyWitness == '\0') &&
     (iVar12 = __cxa_guard_acquire(&VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
                                    ::emptyWitness), iVar12 != 0)) {
    VerifyScript::emptyWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    VerifyScript::emptyWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    VerifyScript::emptyWitness.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(CScriptWitness::~CScriptWitness,&VerifyScript::emptyWitness,&__dso_handle);
    __cxa_guard_release(&VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
                         ::emptyWitness);
  }
  witness_00 = &VerifyScript::emptyWitness;
  if (witness != (CScriptWitness *)0x0) {
    witness_00 = witness;
  }
  if (serror != (ScriptError *)0x0) {
    *serror = SCRIPT_ERR_UNKNOWN_ERROR;
  }
  if (((flags & 0x20) != 0) && (bVar8 = CScript::IsPushOnly(scriptSig), !bVar8)) {
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_SIG_PUSHONLY;
    }
    bVar8 = false;
    goto LAB_001de99f;
  }
  local_98.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = EvalScript(&local_98,scriptSig,flags,checker,BASE,serror);
  if (bVar8) {
    if ((flags & 1) != 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&local_b8,&local_98);
    }
    bVar8 = EvalScript(&local_98,scriptPubKey,flags,checker,BASE,serror);
    if (!bVar8) goto LAB_001de986;
    if ((local_98.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_98.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (bVar8 = CastToBool(local_98.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1), !bVar8)) {
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_EVAL_FALSE;
      }
      goto LAB_001de986;
    }
    witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((flags >> 0xb & 1) == 0) ||
       (bVar8 = CScript::IsWitnessProgram(scriptPubKey,&witnessversion,&witnessprogram), !bVar8)) {
      bVar8 = false;
LAB_001de9cd:
      if ((flags & 1) == 0) {
        if ((flags >> 8 & 1) != 0) {
          __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x80b,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
        if ((flags >> 0xb & 1) != 0) {
          __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                        ,0x816,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
      }
      else {
        bVar9 = CScript::IsPayToScriptHash(scriptPubKey);
        if (bVar9) {
          bVar9 = CScript::IsPushOnly(scriptSig);
          pvVar7 = local_98.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar6 = local_98.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar5 = local_98.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = local_b8.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar3 = local_b8.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (!bVar9) {
            bVar8 = false;
            if (serror != (ScriptError *)0x0) {
              SVar11 = SCRIPT_ERR_SIG_PUSHONLY;
              goto LAB_001dec7c;
            }
            goto LAB_001dec7f;
          }
          local_98.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_b8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_98.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_b8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_98.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pvVar5;
          local_b8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
          local_b8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar7;
          if (pvVar3 == pvVar4) {
            __assert_fail("!stack.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                          ,0x7e4,
                          "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                         );
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    (&pubKey2.super_CScriptBase,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          popstack(&local_98);
          bVar9 = EvalScript(&local_98,&pubKey2,flags,checker,BASE,serror);
          if (bVar9) {
            if ((local_98.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_98.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) ||
               (bVar9 = CastToBool(local_98.
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1), !bVar9)) {
              if (serror != (ScriptError *)0x0) {
                SVar11 = SCRIPT_ERR_EVAL_FALSE;
LAB_001debfe:
                *serror = SVar11;
              }
              goto LAB_001dec01;
            }
            bVar9 = true;
            if ((flags >> 0xb & 1) != 0) {
              local_100.ptr = (uchar *)&pubKey2;
              bVar10 = CScript::IsWitnessProgram
                                 ((CScript *)local_100.ptr,&witnessversion,&witnessprogram);
              if (bVar10) {
                local_78._16_8_ = 0;
                local_78._24_8_ = 0;
                local_78._0_8_ = (char *)0x0;
                local_78._8_8_ = 0;
                if (0x1c < pubKey2.super_CScriptBase._size) {
                  local_100.ptr =
                       (uchar *)pubKey2.super_CScriptBase._union.indirect_contents.indirect;
                  pubKey2.super_CScriptBase._size = pubKey2.super_CScriptBase._size - 0x1d;
                }
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f0,
                           local_100,
                           (iterator)(local_100.ptr + (int)pubKey2.super_CScriptBase._size),
                           &local_f1);
                b._M_extent._M_extent_value =
                     (long)local_f0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_f0._M_impl.super__Vector_impl_data._M_start;
                b._M_ptr = local_f0._M_impl.super__Vector_impl_data._M_start;
                other = &CScript::operator<<((CScript *)local_78,b)->super_CScriptBase;
                bVar8 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                                  (&scriptSig->super_CScriptBase,other);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&local_f0);
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
                if (bVar8) {
                  bVar8 = true;
                  if (serror != (ScriptError *)0x0) {
                    SVar11 = SCRIPT_ERR_WITNESS_MALLEATED_P2SH;
                    goto LAB_001debfe;
                  }
                }
                else {
                  bVar8 = VerifyWitnessProgram
                                    (witness_00,witnessversion,&witnessprogram,flags,checker,serror,
                                     true);
                  if (bVar8) {
                    bVar9 = true;
                    std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::resize(&local_98,1);
                    bVar8 = true;
                    goto LAB_001dec04;
                  }
                  bVar8 = true;
                }
                goto LAB_001dec01;
              }
            }
          }
          else {
LAB_001dec01:
            bVar9 = false;
          }
LAB_001dec04:
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pubKey2.super_CScriptBase);
          if (!bVar9) goto LAB_001dec6f;
        }
        if ((flags >> 8 & 1) == 0) {
          if ((flags >> 0xb & 1) != 0 && !bVar8) {
LAB_001dec57:
            if ((witness_00->stack).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (witness_00->stack).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              bVar8 = false;
              if (serror != (ScriptError *)0x0) {
                SVar11 = SCRIPT_ERR_WITNESS_UNEXPECTED;
                goto LAB_001dec7c;
              }
              goto LAB_001dec7f;
            }
          }
        }
        else {
          if ((flags >> 0xb & 1) == 0) {
            __assert_fail("(flags & SCRIPT_VERIFY_WITNESS) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                          ,0x80c,
                          "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                         );
          }
          if ((long)local_98.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x18) {
            bVar8 = false;
            if (serror != (ScriptError *)0x0) {
              SVar11 = SCRIPT_ERR_CLEANSTACK;
              goto LAB_001dec7c;
            }
            goto LAB_001dec7f;
          }
          if (!bVar8) goto LAB_001dec57;
        }
      }
      SVar11 = SCRIPT_ERR_OK;
      bVar8 = true;
      if (serror != (ScriptError *)0x0) {
LAB_001dec7d:
        *serror = SVar11;
      }
    }
    else {
      uVar1 = (scriptSig->super_CScriptBase)._size;
      uVar13 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar13 = uVar1;
      }
      if (uVar13 == 0) {
        bVar8 = VerifyWitnessProgram
                          (witness_00,witnessversion,&witnessprogram,flags,checker,serror,false);
        if (bVar8) {
          bVar8 = true;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize(&local_98,1);
          goto LAB_001de9cd;
        }
LAB_001dec6f:
        bVar8 = false;
      }
      else {
        bVar8 = false;
        if (serror != (ScriptError *)0x0) {
          SVar11 = SCRIPT_ERR_WITNESS_MALLEATED;
LAB_001dec7c:
          bVar8 = false;
          goto LAB_001dec7d;
        }
      }
    }
LAB_001dec7f:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
LAB_001de986:
    bVar8 = false;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_98);
LAB_001de99f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool VerifyScript(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror)
{
    static const CScriptWitness emptyWitness;
    if (witness == nullptr) {
        witness = &emptyWitness;
    }
    bool hadWitness = false;

    set_error(serror, SCRIPT_ERR_UNKNOWN_ERROR);

    if ((flags & SCRIPT_VERIFY_SIGPUSHONLY) != 0 && !scriptSig.IsPushOnly()) {
        return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);
    }

    // scriptSig and scriptPubKey must be evaluated sequentially on the same stack
    // rather than being simply concatenated (see CVE-2010-5141)
    std::vector<std::vector<unsigned char> > stack, stackCopy;
    if (!EvalScript(stack, scriptSig, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (flags & SCRIPT_VERIFY_P2SH)
        stackCopy = stack;
    if (!EvalScript(stack, scriptPubKey, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (stack.empty())
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    if (CastToBool(stack.back()) == false)
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

    // Bare witness programs
    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (flags & SCRIPT_VERIFY_WITNESS) {
        if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
            hadWitness = true;
            if (scriptSig.size() != 0) {
                // The scriptSig must be _exactly_ CScript(), otherwise we reintroduce malleability.
                return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED);
            }
            if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/false)) {
                return false;
            }
            // Bypass the cleanstack check at the end. The actual stack is obviously not clean
            // for witness programs.
            stack.resize(1);
        }
    }

    // Additional validation for spend-to-script-hash transactions:
    if ((flags & SCRIPT_VERIFY_P2SH) && scriptPubKey.IsPayToScriptHash())
    {
        // scriptSig must be literals-only or validation fails
        if (!scriptSig.IsPushOnly())
            return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);

        // Restore stack.
        swap(stack, stackCopy);

        // stack cannot be empty here, because if it was the
        // P2SH  HASH <> EQUAL  scriptPubKey would be evaluated with
        // an empty stack and the EvalScript above would return false.
        assert(!stack.empty());

        const valtype& pubKeySerialized = stack.back();
        CScript pubKey2(pubKeySerialized.begin(), pubKeySerialized.end());
        popstack(stack);

        if (!EvalScript(stack, pubKey2, flags, checker, SigVersion::BASE, serror))
            // serror is set
            return false;
        if (stack.empty())
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
        if (!CastToBool(stack.back()))
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

        // P2SH witness program
        if (flags & SCRIPT_VERIFY_WITNESS) {
            if (pubKey2.IsWitnessProgram(witnessversion, witnessprogram)) {
                hadWitness = true;
                if (scriptSig != CScript() << std::vector<unsigned char>(pubKey2.begin(), pubKey2.end())) {
                    // The scriptSig must be _exactly_ a single push of the redeemScript. Otherwise we
                    // reintroduce malleability.
                    return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED_P2SH);
                }
                if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/true)) {
                    return false;
                }
                // Bypass the cleanstack check at the end. The actual stack is obviously not clean
                // for witness programs.
                stack.resize(1);
            }
        }
    }

    // The CLEANSTACK check is only performed after potential P2SH evaluation,
    // as the non-P2SH evaluation of a P2SH script will obviously not result in
    // a clean stack (the P2SH inputs remain). The same holds for witness evaluation.
    if ((flags & SCRIPT_VERIFY_CLEANSTACK) != 0) {
        // Disallow CLEANSTACK without P2SH, as otherwise a switch CLEANSTACK->P2SH+CLEANSTACK
        // would be possible, which is not a softfork (and P2SH should be one).
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        assert((flags & SCRIPT_VERIFY_WITNESS) != 0);
        if (stack.size() != 1) {
            return set_error(serror, SCRIPT_ERR_CLEANSTACK);
        }
    }

    if (flags & SCRIPT_VERIFY_WITNESS) {
        // We can't check for correct unexpected witness data if P2SH was off, so require
        // that WITNESS implies P2SH. Otherwise, going from WITNESS->P2SH+WITNESS would be
        // possible, which is not a softfork.
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        if (!hadWitness && !witness->IsNull()) {
            return set_error(serror, SCRIPT_ERR_WITNESS_UNEXPECTED);
        }
    }

    return set_success(serror);
}